

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_spec.cpp
# Opt level: O3

void __thiscall
FParser::ParseVarLine(FParser *this,int newvar_type,DFsScript *newvar_script,int start)

{
  int iVar1;
  
  iVar1 = FindOperator(this,start,this->NumTokens + -1,",");
  while (iVar1 != -1) {
    CreateVariable(this,newvar_type,newvar_script,start,iVar1 + -1);
    start = iVar1 + 1;
    iVar1 = FindOperator(this,start,this->NumTokens + -1,",");
  }
  CreateVariable(this,newvar_type,newvar_script,start,this->NumTokens + -1);
  return;
}

Assistant:

void FParser::ParseVarLine(int newvar_type, DFsScript *newvar_script, int start)
{
	int starttoken = start, endtoken;
	
	while(1)
    {
		endtoken = FindOperator(starttoken, NumTokens-1, ",");
		if(endtoken == -1) break;
		CreateVariable(newvar_type, newvar_script, starttoken, endtoken-1);
		starttoken = endtoken+1;  //start next after end of this one
    }
	// dont forget the last one
	CreateVariable(newvar_type, newvar_script, starttoken, NumTokens-1);
}